

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O3

bool __thiscall
DIS::ArealObjectStatePdu::operator==(ArealObjectStatePdu *this,ArealObjectStatePdu *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  pointer pVVar14;
  ulong uVar15;
  long lVar16;
  
  bVar7 = SyntheticEnvironmentFamilyPdu::operator==
                    (&this->super_SyntheticEnvironmentFamilyPdu,
                     &rhs->super_SyntheticEnvironmentFamilyPdu);
  bVar8 = EntityID::operator==(&this->_objectID,&rhs->_objectID);
  bVar9 = EntityID::operator==(&this->_referencedObjectID,&rhs->_referencedObjectID);
  uVar5 = this->_updateNumber;
  uVar6 = rhs->_updateNumber;
  uVar1 = rhs->_forceID;
  uVar2 = this->_forceID;
  uVar3 = rhs->_modifications;
  uVar4 = this->_modifications;
  bVar10 = EntityType::operator==(&this->_objectType,&rhs->_objectType);
  bVar11 = SixByteChunk::operator==(&this->_objectAppearance,&rhs->_objectAppearance);
  bVar12 = SimulationAddress::operator==(&this->_requesterID,&rhs->_requesterID);
  bVar13 = SimulationAddress::operator==(&this->_receivingID,&rhs->_receivingID);
  bVar7 = (uVar2 == uVar1 && (uVar5 == uVar6 && (bVar9 && (bVar8 && bVar7)))) &&
          (((bVar13 && bVar12) && (bVar11 && bVar10)) && uVar4 == uVar3);
  pVVar14 = (this->_objectLocation).
            super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_objectLocation).
      super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar14) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      bVar8 = Vector3Double::operator==
                        ((Vector3Double *)((long)&pVVar14->_vptr_Vector3Double + lVar16),
                         (Vector3Double *)
                         ((long)&((rhs->_objectLocation).
                                  super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_Vector3Double +
                         lVar16));
      bVar7 = (bool)(bVar7 & bVar8);
      uVar15 = uVar15 + 1;
      pVVar14 = (this->_objectLocation).
                super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x20;
    } while (uVar15 < (ulong)((long)(this->_objectLocation).
                                    super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 5)
            );
  }
  return bVar7;
}

Assistant:

bool ArealObjectStatePdu::operator ==(const ArealObjectStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SyntheticEnvironmentFamilyPdu::operator==(rhs);

     if( ! (_objectID == rhs._objectID) ) ivarsEqual = false;
     if( ! (_referencedObjectID == rhs._referencedObjectID) ) ivarsEqual = false;
     if( ! (_updateNumber == rhs._updateNumber) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_modifications == rhs._modifications) ) ivarsEqual = false;
     if( ! (_objectType == rhs._objectType) ) ivarsEqual = false;
     if( ! (_objectAppearance == rhs._objectAppearance) ) ivarsEqual = false;
     if( ! (_requesterID == rhs._requesterID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _objectLocation.size(); idx++)
     {
        if( ! ( _objectLocation[idx] == rhs._objectLocation[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }